

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::PipelineStatisticsQueryTestFunctional3
          (PipelineStatisticsQueryTestFunctional3 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,
             "functional_primitives_vertices_submitted_and_clipping_input_output_primitives",
             "Verifies that GL_PRIMITIVES_SUBMITTED_ARB, GL_VERTICES_SUBMITTED_ARB, GL_CLIPPING_INPUT_PRIMITIVES_ARB, and GL_CLIPPING_OUTPUT_PRIMITIVES_ARB queries work correctly."
            );
  (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context = context;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_fbo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_po_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_to_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_vao_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_vbo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_to_height = 0x40;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_to_width = 0x40;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_baseinstance_argument
       = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_basevertex_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_firstindex_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_020ec710;
  this->m_is_primitive_restart_enabled = false;
  return;
}

Assistant:

PipelineStatisticsQueryTestFunctional3::PipelineStatisticsQueryTestFunctional3(deqp::Context& context)
	: PipelineStatisticsQueryTestFunctionalBase(
		  context, "functional_primitives_vertices_submitted_and_clipping_input_output_primitives",
		  "Verifies that GL_PRIMITIVES_SUBMITTED_ARB, GL_VERTICES_SUBMITTED_ARB, "
		  "GL_CLIPPING_INPUT_PRIMITIVES_ARB, and GL_CLIPPING_OUTPUT_PRIMITIVES_ARB "
		  "queries work correctly.")
	, m_is_primitive_restart_enabled(false)
{
	/* Left blank intentionally */
}